

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_music.cpp
# Opt level: O0

void Cmd_writemidi(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  FILE *__s;
  uchar *__ptr;
  size_t sVar4;
  bool success;
  FILE *f;
  TArray<unsigned_char,_unsigned_char> midi;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  midi.Count = key;
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 2) {
    if (currSong == (MusInfo *)0x0) {
      Printf("No song is currently playing.\n");
    }
    else {
      uVar2 = (*currSong->_vptr_MusInfo[9])();
      if ((uVar2 & 1) == 0) {
        Printf("Current song is not MIDI-based.\n");
      }
      else {
        TArray<unsigned_char,_unsigned_char>::TArray((TArray<unsigned_char,_unsigned_char> *)&f);
        MIDIStreamer::CreateSMF
                  ((MIDIStreamer *)currSong,(TArray<unsigned_char,_unsigned_char> *)&f,1);
        pcVar3 = FCommandLine::operator[](argv,1);
        __s = fopen(pcVar3,"wb");
        if (__s == (FILE *)0x0) {
          pcVar3 = FCommandLine::operator[](argv,1);
          Printf("Could not open %s.\n",pcVar3);
        }
        else {
          __ptr = TArray<unsigned_char,_unsigned_char>::operator[]
                            ((TArray<unsigned_char,_unsigned_char> *)&f,0);
          uVar2 = TArray<unsigned_char,_unsigned_char>::Size
                            ((TArray<unsigned_char,_unsigned_char> *)&f);
          sVar4 = fwrite(__ptr,1,(ulong)uVar2,__s);
          uVar2 = TArray<unsigned_char,_unsigned_char>::Size
                            ((TArray<unsigned_char,_unsigned_char> *)&f);
          fclose(__s);
          if (sVar4 != uVar2) {
            Printf("Could not write to music file.\n");
          }
        }
        TArray<unsigned_char,_unsigned_char>::~TArray((TArray<unsigned_char,_unsigned_char> *)&f);
      }
    }
  }
  else {
    Printf("Usage: writemidi <filename>");
  }
  return;
}

Assistant:

CCMD (writemidi)
{
	if (argv.argc() != 2)
	{
		Printf("Usage: writemidi <filename>");
		return;
	}
	if (currSong == NULL)
	{
		Printf("No song is currently playing.\n");
		return;
	}
	if (!currSong->IsMIDI())
	{
		Printf("Current song is not MIDI-based.\n");
		return;
	}

	TArray<BYTE> midi;
	FILE *f;
	bool success;

	static_cast<MIDIStreamer *>(currSong)->CreateSMF(midi, 1);
	f = fopen(argv[1], "wb");
	if (f == NULL)
	{
		Printf("Could not open %s.\n", argv[1]);
		return;
	}
	success = (fwrite(&midi[0], 1, midi.Size(), f) == (size_t)midi.Size());
	fclose (f);

	if (!success)
	{
		Printf("Could not write to music file.\n");
	}
}